

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O2

ON_3dPoint * __thiscall
ON_SubDVertex::Point
          (ON_3dPoint *__return_storage_ptr__,ON_SubDVertex *this,
          ON_SubDComponentLocation point_location)

{
  double dVar1;
  undefined3 in_register_00000011;
  int iVar2;
  
  iVar2 = CONCAT31(in_register_00000011,point_location);
  if (iVar2 != 0) {
    if (iVar2 == 2) {
      SurfacePoint(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    if (iVar2 == 1) {
      ControlNetPoint(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr__->z = ON_3dPoint::NanPoint.z;
  dVar1 = ON_3dPoint::NanPoint.y;
  __return_storage_ptr__->x = ON_3dPoint::NanPoint.x;
  __return_storage_ptr__->y = dVar1;
  return __return_storage_ptr__;
}

Assistant:

const ON_3dPoint ON_SubDVertex::Point(ON_SubDComponentLocation point_location) const
{
  switch (point_location)
  {
  case ON_SubDComponentLocation::ControlNet:
    return this->ControlNetPoint();
    break;
  case ON_SubDComponentLocation::Surface:
    return this->SurfacePoint();
    break;
  case ON_SubDComponentLocation::Unset:
    return ON_3dPoint::NanPoint;
    break;
  }
  return ON_3dPoint::NanPoint;
}